

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O3

Pdr_Man_t * Pdr_ManStart(Aig_Man_t *pAig,Pdr_Par_t *pPars,Vec_Int_t *vPrioInit)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  Pdr_Man_t *pMan;
  Gia_Man_t *p;
  Vec_Ptr_t *pVVar4;
  Vec_Vec_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Vec_Wec_t *pVVar8;
  Cnf_Man_t *pCVar9;
  Txs3_Man_t *pTVar10;
  uint *puVar11;
  abctime *paVar12;
  void **__s;
  long lVar13;
  uint uVar14;
  size_t sVar15;
  uint uVar16;
  long lVar17;
  int iVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  pMan = (Pdr_Man_t *)calloc(1,0x1d0);
  pMan->pPars = pPars;
  pMan->pAig = pAig;
  if (((pPars->fFlopPrio == 0) && (pPars->fNewXSim == 0)) && (pPars->fUseAbs == 0)) {
    p = (Gia_Man_t *)0x0;
  }
  else {
    p = Gia_ManFromAigSimple(pAig);
  }
  pMan->pGia = p;
  pVVar4 = (Vec_Ptr_t *)calloc(1,0x10);
  pMan->vSolvers = pVVar4;
  pVVar5 = (Vec_Vec_t *)calloc(1,0x10);
  pMan->vClauses = pVVar5;
  uVar16 = pAig->nRegs;
  piVar6 = (int *)malloc((long)(int)uVar16 << 2);
  pMan->pOrder = piVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(0x400);
  pVVar7->pArray = piVar6;
  pMan->vActVars = pVVar7;
  if (pPars->fMonoCnf == 0) {
    iVar2 = Aig_ManLevels(pAig);
    iVar20 = 1;
    if (1 < iVar2) {
      iVar20 = iVar2;
    }
    pVVar8 = (Vec_Wec_t *)malloc(0x10);
    sVar15 = 8;
    if (6 < iVar2) {
      sVar15 = (size_t)(iVar20 + 1U);
    }
    pVVar8->nCap = (int)sVar15;
    pVVar7 = (Vec_Int_t *)calloc(sVar15,0x10);
    pVVar8->pArray = pVVar7;
    pVVar8->nSize = iVar20 + 1U;
    pMan->vVLits = pVVar8;
    uVar16 = pAig->nRegs;
  }
  uVar14 = uVar16 - 1;
  uVar3 = 0x1f;
  if (uVar14 != 0) {
    for (; uVar14 >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  uVar3 = (uVar3 ^ 0xffffffe0) + 0x21;
  if (uVar16 < 2) {
    uVar3 = uVar16;
  }
  pMan->nPrioShift = uVar3;
  if (vPrioInit == (Vec_Int_t *)0x0) {
    if (pPars->fFlopPrio == 0) {
      vPrioInit = (Vec_Int_t *)malloc(0x10);
      uVar3 = 0x10;
      if (0xe < uVar14) {
        uVar3 = uVar16;
      }
      vPrioInit->nCap = uVar3;
      if (uVar3 == 0) {
        vPrioInit->pArray = (int *)0x0;
        vPrioInit->nSize = uVar16;
      }
      else {
        piVar6 = (int *)malloc((long)(int)uVar3 << 2);
        vPrioInit->pArray = piVar6;
        vPrioInit->nSize = uVar16;
        if (piVar6 != (int *)0x0) {
          memset(piVar6,0,(long)(int)uVar16 << 2);
        }
      }
    }
    else {
      vPrioInit = Pdr_ManDeriveFlopPriorities2(p,1);
    }
  }
  pMan->vPrio = vPrioInit;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vLits = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vCiObjs = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vCoObjs = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vCiVals = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vCoVals = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vNodes = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vUndo = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vVisits = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vCi2Rem = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pMan->vRes = pVVar7;
  pTVar10 = (Txs3_Man_t *)0x0;
  pCVar9 = Cnf_ManStart();
  pMan->pCnfMan = pCVar9;
  if (pPars->fNewXSim != 0) {
    pTVar10 = Txs3_ManStart(pMan,pAig,vPrioInit);
  }
  pMan->pTxs3 = pTVar10;
  if (pAig->pFanData == (int *)0x0) {
    Aig_ManFanoutStart(pAig);
  }
  if (pAig->pTerSimData == (uint *)0x0) {
    iVar20 = pAig->vObjs->nSize;
    iVar2 = iVar20 + 0xf;
    if (-1 < iVar20) {
      iVar2 = iVar20;
    }
    puVar11 = (uint *)calloc((long)((iVar2 >> 4) + 1),4);
    pAig->pTerSimData = puVar11;
  }
  iVar20 = pPars->nTimeOutOne;
  if ((long)iVar20 != 0) {
    iVar2 = pAig->nTruePos;
    lVar17 = (long)iVar2;
    paVar12 = (abctime *)malloc(lVar17 * 8);
    pMan->pTime4Outs = paVar12;
    auVar1 = _DAT_0094e250;
    if (0 < lVar17) {
      lVar13 = (long)iVar20 * 1000 + 1;
      lVar17 = lVar17 + -1;
      auVar18._8_4_ = (int)lVar17;
      auVar18._0_8_ = lVar17;
      auVar18._12_4_ = (int)((ulong)lVar17 >> 0x20);
      lVar17 = 0;
      auVar18 = auVar18 ^ _DAT_0094e250;
      auVar24 = _DAT_0094e240;
      do {
        auVar23 = auVar24 ^ auVar1;
        if ((bool)(~(auVar23._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar23._0_4_ ||
                    auVar18._4_4_ < auVar23._4_4_) & 1)) {
          *(long *)((long)paVar12 + lVar17) = lVar13;
        }
        if ((auVar23._12_4_ != auVar18._12_4_ || auVar23._8_4_ <= auVar18._8_4_) &&
            auVar23._12_4_ <= auVar18._12_4_) {
          *(long *)((long)paVar12 + lVar17 + 8) = lVar13;
        }
        lVar21 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 2;
        auVar24._8_8_ = lVar21 + 2;
        lVar17 = lVar17 + 0x10;
      } while ((ulong)(iVar2 + 1U >> 1) << 4 != lVar17);
    }
  }
  if (pPars->fSolveAll == 0) {
    return pMan;
  }
  iVar20 = pMan->pAig->nTruePos;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar2 = 8;
  if (6 < iVar20 - 1U) {
    iVar2 = iVar20;
  }
  pVVar4->nCap = iVar2;
  if (iVar2 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar2 << 3);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar20;
  memset(__s,0,(long)iVar20 << 3);
  pMan->vCexes = pVVar4;
  uVar16 = pAig->nTruePos;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar16 - 1) {
    uVar3 = uVar16;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar3;
  if (uVar3 == 0) {
    pVVar7->pArray = (int *)0x0;
    pMan->pPars->vOutMap = pVVar7;
    if ((int)uVar16 < 1) goto LAB_005fa3ff;
    sVar15 = (ulong)uVar16 * 4;
LAB_005fa2e0:
    piVar6 = (int *)malloc(sVar15);
LAB_005fa2e8:
    pVVar7->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar7->nCap = uVar16;
  }
  else {
    piVar6 = (int *)malloc((long)(int)uVar3 << 2);
    pVVar7->pArray = piVar6;
    pMan->pPars->vOutMap = pVVar7;
    if ((int)uVar3 < (int)uVar16) {
      sVar15 = (long)(int)uVar16 << 2;
      if (piVar6 == (int *)0x0) goto LAB_005fa2e0;
      piVar6 = (int *)realloc(piVar6,sVar15);
      goto LAB_005fa2e8;
    }
  }
  auVar1 = _DAT_0094e250;
  if (0 < (int)uVar16) {
    lVar17 = (ulong)uVar16 - 1;
    auVar19._8_4_ = (int)lVar17;
    auVar19._0_8_ = lVar17;
    auVar19._12_4_ = (int)((ulong)lVar17 >> 0x20);
    lVar17 = 0;
    auVar19 = auVar19 ^ _DAT_0094e250;
    auVar23 = _DAT_0094f530;
    auVar22 = _DAT_0094e240;
    do {
      auVar24 = auVar22 ^ auVar1;
      iVar20 = auVar19._4_4_;
      if ((bool)(~(auVar24._4_4_ == iVar20 && auVar19._0_4_ < auVar24._0_4_ ||
                  iVar20 < auVar24._4_4_) & 1)) {
        *(undefined4 *)((long)piVar6 + lVar17) = 0xfffffffe;
      }
      if ((auVar24._12_4_ != auVar19._12_4_ || auVar24._8_4_ <= auVar19._8_4_) &&
          auVar24._12_4_ <= auVar19._12_4_) {
        *(undefined4 *)((long)piVar6 + lVar17 + 4) = 0xfffffffe;
      }
      auVar24 = auVar23 ^ auVar1;
      iVar2 = auVar24._4_4_;
      if (iVar2 <= iVar20 && (iVar2 != iVar20 || auVar24._0_4_ <= auVar19._0_4_)) {
        *(undefined4 *)((long)piVar6 + lVar17 + 8) = 0xfffffffe;
        *(undefined4 *)((long)piVar6 + lVar17 + 0xc) = 0xfffffffe;
      }
      lVar13 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 4;
      auVar22._8_8_ = lVar13 + 4;
      lVar13 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 4;
      auVar23._8_8_ = lVar13 + 4;
      lVar17 = lVar17 + 0x10;
    } while ((ulong)(uVar16 + 3 >> 2) << 4 != lVar17);
  }
LAB_005fa3ff:
  pVVar7->nSize = uVar16;
  return pMan;
}

Assistant:

Pdr_Man_t * Pdr_ManStart( Aig_Man_t * pAig, Pdr_Par_t * pPars, Vec_Int_t * vPrioInit )
{
    Pdr_Man_t * p;
    p = ABC_CALLOC( Pdr_Man_t, 1 );
    p->pPars    = pPars;
    p->pAig     = pAig;
    p->pGia     = (pPars->fFlopPrio || p->pPars->fNewXSim || p->pPars->fUseAbs) ? Gia_ManFromAigSimple(pAig) : NULL;
    p->vSolvers = Vec_PtrAlloc( 0 );
    p->vClauses = Vec_VecAlloc( 0 );
    p->pQueue   = NULL;
    p->pOrder   = ABC_ALLOC( int, Aig_ManRegNum(pAig) );
    p->vActVars = Vec_IntAlloc( 256 );
    if ( !p->pPars->fMonoCnf )
        p->vVLits   = Vec_WecStart( 1+Abc_MaxInt(1, Aig_ManLevels(pAig)) );
    // internal use
    p->nPrioShift = Abc_Base2Log(Aig_ManRegNum(pAig));
    if ( vPrioInit )
        p->vPrio = vPrioInit;
    else if ( pPars->fFlopPrio )
        p->vPrio = Pdr_ManDeriveFlopPriorities2(p->pGia, 1);
//    else if ( p->pPars->fNewXSim )
//        p->vPrio = Vec_IntStartNatural( Aig_ManRegNum(pAig) );
    else 
        p->vPrio = Vec_IntStart( Aig_ManRegNum(pAig) );
    p->vLits    = Vec_IntAlloc( 100 );  // array of literals
    p->vCiObjs  = Vec_IntAlloc( 100 );  // cone leaves
    p->vCoObjs  = Vec_IntAlloc( 100 );  // cone roots
    p->vCiVals  = Vec_IntAlloc( 100 );  // cone leaf values
    p->vCoVals  = Vec_IntAlloc( 100 );  // cone root values
    p->vNodes   = Vec_IntAlloc( 100 );  // cone nodes
    p->vUndo    = Vec_IntAlloc( 100 );  // cone undos
    p->vVisits  = Vec_IntAlloc( 100 );  // intermediate
    p->vCi2Rem  = Vec_IntAlloc( 100 );  // CIs to be removed
    p->vRes     = Vec_IntAlloc( 100 );  // final result
    p->pCnfMan  = Cnf_ManStart();
    // ternary simulation
    p->pTxs3    = pPars->fNewXSim ? Txs3_ManStart( p, pAig, p->vPrio ) : NULL;
    // additional AIG data-members
    if ( pAig->pFanData == NULL )
        Aig_ManFanoutStart( pAig );
    if ( pAig->pTerSimData == NULL )
        pAig->pTerSimData = ABC_CALLOC( unsigned, 1 + (Aig_ManObjNumMax(pAig) / 16) );
    // time spent on each outputs
    if ( pPars->nTimeOutOne )
    {
        int i;
        p->pTime4Outs = ABC_ALLOC( abctime, Saig_ManPoNum(pAig) );
        for ( i = 0; i < Saig_ManPoNum(pAig); i++ )
            p->pTime4Outs[i] = pPars->nTimeOutOne * CLOCKS_PER_SEC / 1000 + 1;
    }
    if ( pPars->fSolveAll )
    {
        p->vCexes = Vec_PtrStart( Saig_ManPoNum(p->pAig) );
        p->pPars->vOutMap = Vec_IntAlloc( Saig_ManPoNum(pAig) );
        Vec_IntFill( p->pPars->vOutMap, Saig_ManPoNum(pAig), -2 );
    }
    return p;
}